

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O1

void __thiscall MT32Emu::Part::setDataEntryMSB(Part *this,uchar midiDataEntryMSB)

{
  byte bVar1;
  
  if ((this->nrpn == false) && (this->rpn == 0)) {
    bVar1 = 0x18;
    if (midiDataEntryMSB < 0x18) {
      bVar1 = midiDataEntryMSB;
    }
    (this->patchTemp->patch).benderRange = bVar1;
    this->pitchBenderRange = (ushort)bVar1 * 0x2ab;
  }
  return;
}

Assistant:

void Part::setDataEntryMSB(unsigned char midiDataEntryMSB) {
	if (nrpn) {
		// The last RPN-related control change was for an NRPN,
		// which the real synths don't support.
		return;
	}
	if (rpn != 0) {
		// The RPN has been set to something other than 0,
		// which is the only RPN that these synths support
		return;
	}
	patchTemp->patch.benderRange = midiDataEntryMSB > 24 ? 24 : midiDataEntryMSB;
	updatePitchBenderRange();
}